

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O2

void period_certification(dsfmt_t *dsfmt)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = *(ulong *)((long)dsfmt->status + 0xbf8);
  uVar3 = ((ulong)((uint)uVar1 & 1) | dsfmt->status[0xbf].u[0] & 0x3d84e1ac0dc82880) ^
          0x1000412401080000;
  for (uVar2 = 0x20; uVar2 != 0; uVar2 = uVar2 >> 1) {
    uVar3 = uVar3 ^ uVar3 >> (sbyte)uVar2;
  }
  if ((uVar3 & 1) == 0) {
    *(ulong *)((long)dsfmt->status + 0xbf8) = uVar1 ^ 1;
  }
  return;
}

Assistant:

static void period_certification(dsfmt_t* dsfmt)
{
	uint64_t pcv[2] = {DSFMT_PCV1, DSFMT_PCV2};
	uint64_t tmp[2];
	uint64_t inner;
	int i;
#if (DSFMT_PCV2 & 1) != 1
    int j;
    uint64_t work;
#endif

	tmp[0] = (dsfmt->status[DSFMT_N].u[0] ^ DSFMT_FIX1);
	tmp[1] = (dsfmt->status[DSFMT_N].u[1] ^ DSFMT_FIX2);

	inner = tmp[0] & pcv[0];
	inner ^= tmp[1] & pcv[1];
	for (i = 32; i > 0; i >>= 1)
	{
		inner ^= inner >> i;
	}
	inner &= 1;
	/* check OK */
	if (inner == 1)
	{
		return;
	}
	/* check NG, and modification */
#if (DSFMT_PCV2 & 1) == 1
	dsfmt->status[DSFMT_N].u[1] ^= 1;
#else
    for (i = 1; i >= 0; i--) {
	work = 1;
	for (j = 0; j < 64; j++) {
	    if ((work & pcv[i]) != 0) {
		dsfmt->status[DSFMT_N].u[i] ^= work;
		return;
	    }
	    work = work << 1;
	}
    }
#endif
}